

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_viewport.cpp
# Opt level: O2

bool __thiscall ON_Viewport::IsValid(ON_Viewport *this,ON_TextLog *text_log)

{
  char *format;
  
  if (this->m_bValidCamera == false) {
    if (text_log == (ON_TextLog *)0x0) {
      return false;
    }
    format = "invalid viewport camera settings.\n";
  }
  else if (this->m_bValidFrustum == false) {
    if (text_log == (ON_TextLog *)0x0) {
      return false;
    }
    format = "invalid viewport frustum settings.\n";
  }
  else {
    if (this->m_bValidPort != false) {
      return true;
    }
    if (text_log == (ON_TextLog *)0x0) {
      return false;
    }
    format = "invalid viewport port extents settings.\n";
  }
  ON_TextLog::Print(text_log,format);
  return false;
}

Assistant:

bool ON_Viewport::IsValid( ON_TextLog* text_log ) const
{
  if ( !IsValidCamera() )
  {
    if ( 0 != text_log )
    {
      text_log->Print("invalid viewport camera settings.\n");
    }
    return false;
  }
  if ( !IsValidFrustum() )
  {
    if ( 0 != text_log )
    {
      text_log->Print("invalid viewport frustum settings.\n");
    }
    return false;
  }
  if ( !m_bValidPort )
  {
    if ( 0 != text_log )
    {
      text_log->Print("invalid viewport port extents settings.\n");
    }
    return false;
  }
  return true;
}